

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportMan.cpp
# Opt level: O0

void __thiscall
adios2::transportman::TransportMan::OpenFileID
          (TransportMan *this,string *name,size_t id,Mode mode,Params *parameters,bool profile)

{
  long in_RDI;
  shared_ptr<adios2::Transport> file;
  bool in_stack_0000015e;
  bool in_stack_0000015f;
  Params *in_stack_00000160;
  Mode in_stack_0000016c;
  string *in_stack_00000170;
  TransportMan *in_stack_00000178;
  Comm *in_stack_00000198;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff0c;
  pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_> *this_00;
  value_type *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  Params *in_stack_ffffffffffffffc8;
  
  helper::LowerCaseParams(in_stack_ffffffffffffffc8);
  this_00 = *(pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_> **)(in_RDI + 0x48);
  uVar1 = 0;
  OpenFileTransport(in_stack_00000178,in_stack_00000170,in_stack_0000016c,in_stack_00000160,
                    in_stack_0000015f,in_stack_0000015e,in_stack_00000198);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0xd65426);
  std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>::
  pair<std::shared_ptr<adios2::Transport>_&,_true>
            (this_00,(unsigned_long *)CONCAT44(in_stack_ffffffffffffff0c,uVar1),
             (shared_ptr<adios2::Transport> *)0xd6544e);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
  ::insert((unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
           in_stack_ffffffffffffff18);
  std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>::~pair
            ((pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_> *)0xd65486);
  std::shared_ptr<adios2::Transport>::~shared_ptr((shared_ptr<adios2::Transport> *)0xd65493);
  return;
}

Assistant:

void TransportMan::OpenFileID(const std::string &name, const size_t id, const Mode mode,
                              const Params &parameters, const bool profile)
{
    std::shared_ptr<Transport> file =
        OpenFileTransport(name, mode, helper::LowerCaseParams(parameters), profile, false, m_Comm);
    m_Transports.insert({id, file});
}